

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

FT_Error ps_hints_close(PS_Hints hints,FT_UInt end_point)

{
  FT_Memory memory;
  int iVar1;
  FT_Error FVar2;
  
  iVar1 = hints->error;
  if (iVar1 == 0) {
    memory = hints->memory;
    iVar1 = ps_dimension_end(hints->dimension,end_point,memory);
    if (iVar1 == 0) {
      FVar2 = ps_dimension_end(hints->dimension + 1,end_point,memory);
      return FVar2;
    }
  }
  return iVar1;
}

Assistant:

static FT_Error
  ps_hints_close( PS_Hints  hints,
                  FT_UInt   end_point )
  {
    FT_Error  error;


    error = hints->error;
    if ( !error )
    {
      FT_Memory     memory = hints->memory;
      PS_Dimension  dim    = hints->dimension;


      error = ps_dimension_end( &dim[0], end_point, memory );
      if ( !error )
      {
        error = ps_dimension_end( &dim[1], end_point, memory );
      }
    }

#ifdef DEBUG_HINTER
    if ( !error )
      ps_debug_hints = hints;
#endif
    return error;
  }